

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::verifyBuffers
          (XFBCaptureInactiveOutputVariableTest *this,bufferCollection *buffers)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  GLchar *local_1e8 [3];
  MessageBuilder local_1d0;
  int local_50;
  int local_4c;
  int res_goten;
  int res_gohan;
  GLubyte *expected_data;
  GLubyte *buffer_data;
  bufferDescriptor *descriptor;
  Buffer *buffer;
  pair *pair;
  bufferCollection *pbStack_18;
  bool result;
  bufferCollection *buffers_local;
  XFBCaptureInactiveOutputVariableTest *this_local;
  
  pair._7_1_ = 1;
  pbStack_18 = buffers;
  buffers_local = (bufferCollection *)this;
  buffer = (Buffer *)
           std::
           vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ::operator[](&buffers->m_vector,1);
  descriptor = *(bufferDescriptor **)buffer;
  buffer_data = (GLubyte *)buffer->m_context;
  Utils::Buffer::Bind((Buffer *)descriptor);
  expected_data = (GLubyte *)Utils::Buffer::Map((Buffer *)descriptor,ReadOnly);
  _res_goten = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)buffer_data,0);
  local_4c = memcmp(expected_data + 0x20,_res_goten + 0x20,0x10);
  local_50 = memcmp(expected_data,_res_goten,0x10);
  if ((local_4c != 0) || (local_50 != 0)) {
    this_00 = deqp::Context::getTestContext
                        ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [25])"Invalid result. Buffer: ");
    local_1e8[0] = Utils::Buffer::GetBufferName(*(BUFFERS *)(buffer_data + 0x34));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1e8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])". Index: ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(buffer_data + 0x30));
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    pair._7_1_ = 0;
  }
  Utils::Buffer::UnMap((Buffer *)descriptor);
  return (bool)(pair._7_1_ & 1);
}

Assistant:

bool XFBCaptureInactiveOutputVariableTest::verifyBuffers(bufferCollection& buffers)
{
	bool result = true;

	bufferCollection::pair& pair	   = buffers.m_vector[1] /* xfb */;
	Utils::Buffer*			buffer	 = pair.m_buffer;
	bufferDescriptor*		descriptor = pair.m_descriptor;

	/* Get pointer to contents of buffer */
	buffer->Bind();
	GLubyte* buffer_data = (GLubyte*)buffer->Map(Utils::Buffer::ReadOnly);

	/* Get pointer to expected data */
	GLubyte* expected_data = (GLubyte*)&descriptor->m_expected_data[0];

	/* Compare */
	static const GLuint vec4_size = 16;

	int res_gohan = memcmp(buffer_data + 2 * vec4_size, expected_data + 2 * vec4_size, vec4_size);
	int res_goten = memcmp(buffer_data + 0 * vec4_size, expected_data + 0 * vec4_size, vec4_size);

	if ((0 != res_gohan) || (0 != res_goten))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Invalid result. Buffer: " << Utils::Buffer::GetBufferName(descriptor->m_target)
			<< ". Index: " << descriptor->m_index << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Release buffer mapping */
	buffer->UnMap();

	return result;
}